

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-quantize-stats.cpp
# Opt level: O1

void test_roundtrip_on_chunk
               (ggml_tensor *layer,int64_t offset,int64_t chunk_size,ggml_type_traits *qfns,
               ggml_type_traits_cpu *qfns_cpu,bool use_reference,float *input_scratch,
               char *quantized_scratch,float *output_scratch,error_stats *stats)

{
  ulong uVar1;
  long lVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if (layer->type == GGML_TYPE_F16) {
    if (0 < chunk_size) {
      lVar2 = 0;
      do {
        fVar3 = (float)ggml_get_f32_1d(layer,(int)offset + (int)lVar2);
        input_scratch[lVar2] = fVar3;
        lVar2 = lVar2 + 1;
      } while (chunk_size != lVar2);
    }
  }
  else {
    lVar2 = ggml_get_data_f32(layer);
    input_scratch = (float *)(lVar2 + offset * 4);
  }
  if (use_reference) {
    qfns_cpu = (ggml_type_traits_cpu *)&qfns->from_float_ref;
  }
  (*qfns_cpu->from_float)(input_scratch,quantized_scratch,chunk_size);
  (*qfns->to_float)(quantized_scratch,output_scratch,chunk_size);
  if (0 < chunk_size) {
    dVar6 = stats->total_error;
    dVar7 = stats->max_error;
    lVar2 = 0;
    do {
      dVar4 = (double)(input_scratch[lVar2] - output_scratch[lVar2]);
      dVar6 = dVar6 + dVar4 * dVar4;
      dVar4 = ABS(dVar4);
      dVar5 = dVar7;
      if (dVar7 <= dVar4) {
        dVar5 = dVar4;
      }
      dVar7 = (double)(-(ulong)NAN(dVar4) & (ulong)dVar7 | ~-(ulong)NAN(dVar4) & (ulong)dVar5);
      dVar5 = floor((dVar4 / 0.03) * 150.0);
      uVar1 = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
      if (0x94 < uVar1) {
        uVar1 = 0x95;
      }
      stats->error_histogram[uVar1 & 0xffffffff] = stats->error_histogram[uVar1 & 0xffffffff] + 1;
      lVar2 = lVar2 + 1;
    } while (chunk_size != lVar2);
    stats->total_error = dVar6;
    stats->max_error = dVar7;
  }
  stats->num_samples = stats->num_samples + chunk_size;
  return;
}

Assistant:

static void test_roundtrip_on_chunk(
    const ggml_tensor * layer, int64_t offset, int64_t chunk_size, const ggml_type_traits & qfns, const ggml_type_traits_cpu & qfns_cpu, bool use_reference,
    float * input_scratch, char * quantized_scratch, float * output_scratch, error_stats & stats
) {
    if (layer->type == GGML_TYPE_F16) {
        for (int i = 0; i < chunk_size; i++) {
            input_scratch[i] = ggml_get_f32_1d(layer, i + offset);
        }
    } else {
        input_scratch = ggml_get_data_f32(layer) + offset;
    }

    if (use_reference) {
        qfns.from_float_ref(input_scratch, quantized_scratch, chunk_size);
    } else {
        qfns_cpu.from_float(input_scratch, quantized_scratch, chunk_size);
    }
    qfns.to_float(quantized_scratch, output_scratch, chunk_size);

    update_error_stats(chunk_size, input_scratch, output_scratch, stats);
}